

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O3

Spectrum * __thiscall
phyr::BxDF::sample_f
          (Spectrum *__return_storage_ptr__,BxDF *this,Vector3f *wo,Vector3f *wi,Point2f *u,
          double *pdf,BxDFType *sampledType)

{
  double dVar1;
  double dVar2;
  Point2f PVar3;
  
  PVar3 = concentricSampleDisk(u);
  wi->x = PVar3.x;
  wi->y = PVar3.y;
  dVar1 = (1.0 - PVar3.x * PVar3.x) - PVar3.y * PVar3.y;
  if (dVar1 <= 0.0) {
    dVar1 = 0.0;
  }
  dVar1 = SQRT(dVar1);
  wi->z = dVar1;
  dVar2 = wo->z;
  if (dVar2 < 0.0) {
    dVar1 = -dVar1;
    wi->z = dVar1;
    dVar2 = wo->z;
  }
  *pdf = (double)(-(ulong)(0.0 < dVar2 * dVar1) & (ulong)(ABS(dVar1) * 0.3183098861837907));
  (*this->_vptr_BxDF[2])(__return_storage_ptr__,this,wo,wi);
  return __return_storage_ptr__;
}

Assistant:

Spectrum BxDF::sample_f(const Vector3f& wo, Vector3f* wi, const Point2f& u,
                        Real* pdf, BxDFType* sampledType) const {
    // Cosine-sample the hemisphere, flipping the direction if necessary
    *wi = cosineSampleHemisphere(u);
    if (wo.z < 0) wi->z *= -1;

    *pdf = BxDF::pdf(wo, *wi);
    return f(wo, *wi);
}